

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

base_learner * ect_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *op;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_00;
  size_t ws;
  base_learner *l;
  single_learner *base;
  learner<ect,_example> *plVar3;
  free_ptr<ect> data;
  string link;
  option_group_definition new_options;
  allocator local_377;
  allocator local_376;
  allocator local_375;
  allocator local_374;
  allocator local_373;
  allocator local_372;
  allocator local_371;
  free_ptr<ect> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  string local_2e0 [32];
  string local_2c0;
  string local_2a0 [32];
  string local_280;
  string local_260;
  option_group_definition local_240;
  undefined1 local_208 [112];
  bool local_198;
  typed_option<unsigned_long> local_168;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  
  scoped_calloc_or_throw<ect>();
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&local_260,"Error Correcting Tournament Options",(allocator *)local_208);
  VW::config::option_group_definition::option_group_definition(&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string((string *)&local_280,"ect",&local_371);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_208,&local_280,
             &(local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
              _M_head_impl)->k);
  local_198 = true;
  std::__cxx11::string::string(local_2a0,"Error correcting tournament with <k> labels",&local_372);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&local_240,(typed_option<unsigned_long> *)local_208);
  std::__cxx11::string::string((string *)&local_2c0,"error",&local_373);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_168,&local_2c0,
             &(local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
              _M_head_impl)->errors);
  local_168.super_base_option.m_keep = true;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_168,0);
  std::__cxx11::string::string(local_2e0,"errors allowed by ECT",&local_374);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar2,op);
  std::__cxx11::string::string((string *)&local_300,"link",&local_375);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_c8,&local_300,&local_360);
  std::__cxx11::string::string((string *)&local_320,"identity",&local_376);
  op_00 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_c8,&local_320);
  (op_00->super_base_option).m_keep = true;
  std::__cxx11::string::string
            (local_340,"Specify the link function: identity, logistic, glf1 or poisson",&local_377);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar2,op_00);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string((string *)&local_320);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string(local_2e0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string(local_2a0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_208);
  std::__cxx11::string::~string((string *)&local_280);
  (**options->_vptr_options_i)(options,&local_240);
  std::__cxx11::string::string((string *)local_208,"ect",(allocator *)&local_168);
  iVar1 = (*options->_vptr_options_i[1])(options,local_208);
  std::__cxx11::string::~string((string *)local_208);
  if ((char)iVar1 == '\0') {
    plVar3 = (learner<ect,_example> *)0x0;
  }
  else {
    ws = create_circuit(local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_ect_*,_false>._M_head_impl,
                        (local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ect_*,_false>._M_head_impl)->k,
                        (local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ect_*,_false>._M_head_impl)->errors + 1);
    l = setup_base(options,all);
    iVar1 = std::__cxx11::string::compare((char *)&local_360);
    if (iVar1 == 0) {
      (local_370._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
      _M_head_impl)->class_boundary = 0.5;
    }
    base = LEARNER::as_singleline<char,char>(l);
    plVar3 = LEARNER::init_multiclass_learner<ect,example,LEARNER::learner<char,example>>
                       (&local_370,base,learn,predict,all->p,ws,multiclass);
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_240);
  std::__cxx11::string::~string((string *)&local_360);
  std::unique_ptr<ect,_void_(*)(void_*)>::~unique_ptr(&local_370);
  return (base_learner *)plVar3;
}

Assistant:

base_learner* ect_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<ect>();
  std::string link;
  option_group_definition new_options("Error Correcting Tournament Options");
  new_options.add(make_option("ect", data->k).keep().help("Error correcting tournament with <k> labels"))
      .add(make_option("error", data->errors).keep().default_value(0).help("errors allowed by ECT"))
      // Used to check value. TODO replace
      .add(make_option("link", link)
               .default_value("identity")
               .keep()
               .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("ect"))
    return nullptr;

  size_t wpp = create_circuit(*data.get(), data->k, data->errors + 1);

  base_learner* base = setup_base(options, all);
  if (link.compare("logistic") == 0)
    data->class_boundary = 0.5;  // as --link=logistic maps predictions in [0;1]

  learner<ect, example>& l = init_multiclass_learner(data, as_singleline(base), learn, predict, all.p, wpp);
  l.set_finish(finish);

  return make_base(l);
}